

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::CreateDecimalReaderInternal<false>
          (duckdb *this,ParquetReader *reader,ParquetColumnSchema *schema)

{
  PhysicalType PVar1;
  ColumnReader *this_00;
  undefined *puVar2;
  InternalException *this_01;
  string local_48;
  
  PVar1 = (schema->type).physical_type_;
  switch(PVar1) {
  case INT16:
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
    this_00[1].column_schema = (ParquetColumnSchema *)0x0;
    puVar2 = &DecimalColumnReader<short,false>::vtable;
    break;
  case UINT32:
  case UINT64:
  case UINT64|UINT8:
  case FLOAT:
switchD_010d4145_caseD_6:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unrecognized type for Decimal","");
    InternalException::InternalException(this_01,&local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case INT32:
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
    this_00[1].column_schema = (ParquetColumnSchema *)0x0;
    puVar2 = &DecimalColumnReader<int,false>::vtable;
    break;
  case INT64:
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
    this_00[1].column_schema = (ParquetColumnSchema *)0x0;
    puVar2 = &DecimalColumnReader<long,false>::vtable;
    break;
  case DOUBLE:
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
    this_00[1].column_schema = (ParquetColumnSchema *)0x0;
    puVar2 = &DecimalColumnReader<double,false>::vtable;
    break;
  default:
    if (PVar1 != INT128) goto switchD_010d4145_caseD_6;
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
    this_00[1].column_schema = (ParquetColumnSchema *)0x0;
    puVar2 = &DecimalColumnReader<duckdb::hugeint_t,false>::vtable;
  }
  this_00->_vptr_ColumnReader = (_func_int **)(puVar2 + 0x10);
  *(ColumnReader **)this = this_00;
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
}

Assistant:

unique_ptr<ColumnReader> CreateDecimalReaderInternal(ParquetReader &reader, const ParquetColumnSchema &schema) {
	switch (schema.type.InternalType()) {
	case PhysicalType::INT16:
		return make_uniq<DecimalColumnReader<int16_t, FIXED>>(reader, schema);
	case PhysicalType::INT32:
		return make_uniq<DecimalColumnReader<int32_t, FIXED>>(reader, schema);
	case PhysicalType::INT64:
		return make_uniq<DecimalColumnReader<int64_t, FIXED>>(reader, schema);
	case PhysicalType::INT128:
		return make_uniq<DecimalColumnReader<hugeint_t, FIXED>>(reader, schema);
	case PhysicalType::DOUBLE:
		return make_uniq<DecimalColumnReader<double, FIXED>>(reader, schema);
	default:
		throw InternalException("Unrecognized type for Decimal");
	}
}